

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  Message *pMVar1;
  long lVar2;
  long lVar3;
  char local_51;
  long local_50;
  size_t i;
  Message env_var;
  undefined1 local_38 [8];
  string full_flag;
  char *flag_local;
  
  full_flag.field_2._8_8_ = this;
  Message::Message(&env_var);
  pMVar1 = Message::operator<<(&env_var,(char (*) [7])"gtest_");
  pMVar1 = Message::operator<<(pMVar1,(char **)((long)&full_flag.field_2 + 8));
  Message::GetString_abi_cxx11_((string *)local_38,pMVar1);
  Message::~Message(&env_var);
  Message::Message((Message *)&i);
  local_50 = 0;
  while( true ) {
    lVar3 = local_50;
    lVar2 = std::__cxx11::string::length();
    if (lVar3 == lVar2) break;
    lVar3 = std::__cxx11::string::c_str();
    local_51 = ToUpper(*(char *)(lVar3 + local_50));
    Message::operator<<((Message *)&i,&local_51);
    local_50 = local_50 + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)&i);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}